

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectdata * conncache_find_first_connection(conncache *connc)

{
  curl_llist_element *pcVar1;
  curl_llist_element *curr;
  connectbundle *bundle;
  curl_hash_element *he;
  curl_hash_iterator iter;
  conncache *connc_local;
  
  iter.current_element = (curl_llist_element *)connc;
  Curl_hash_start_iterate(&connc->hash,(curl_hash_iterator *)&he);
  bundle = (connectbundle *)Curl_hash_next_element((curl_hash_iterator *)&he);
  while( true ) {
    if (bundle == (connectbundle *)0x0) {
      return (connectdata *)0x0;
    }
    pcVar1 = ((bundle->conn_list).tail)->next;
    if (pcVar1 != (curl_llist_element *)0x0) break;
    bundle = (connectbundle *)Curl_hash_next_element((curl_hash_iterator *)&he);
  }
  return (connectdata *)pcVar1->ptr;
}

Assistant:

static struct connectdata *
conncache_find_first_connection(struct conncache *connc)
{
  struct curl_hash_iterator iter;
  struct curl_hash_element *he;
  struct connectbundle *bundle;

  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct curl_llist_element *curr;
    bundle = he->ptr;

    curr = bundle->conn_list.head;
    if(curr) {
      return curr->ptr;
    }

    he = Curl_hash_next_element(&iter);
  }

  return NULL;
}